

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

void __thiscall
Wasm::WasmBytecodeGenerator::WasmBytecodeGenerator
          (WasmBytecodeGenerator *this,ScriptContext *scriptContext,WasmReaderInfo *readerInfo,
          bool validateOnly)

{
  ArenaAllocator *this_00;
  WasmFunctionInfo *pWVar1;
  WebAssemblyModule *pWVar2;
  bool bVar3;
  uint uVar4;
  IWasmByteCodeWriter *pIVar5;
  undefined **ppuVar6;
  WasmBinaryReader *pWVar7;
  
  this->opId = 0;
  this->lastOpId = 1;
  this_00 = &this->m_alloc;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&this_00->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             L"WasmBytecodeGen",&(scriptContext->threadContext->pageAllocator).super_PageAllocator,
             Js::Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
  this->isUnreachable = false;
  this->m_scriptContext = scriptContext;
  bVar3 = Simd::IsEnabled();
  WAsmJs::TypedRegisterAllocator::TypedRegisterAllocator
            (&this->mTypedRegisterAllocator,this_00,AllocateRegisterSpace,(uint)!bVar3 << 4);
  this->currentProfileId = 0;
  (this->m_blockInfos).list.
  super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.alloc = this_00;
  (this->m_blockInfos).list.
  super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>._vptr_ReadOnlyList
       = (_func_int **)&PTR_IsReadOnly_01543b60;
  (this->m_blockInfos).list.
  super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.buffer = (Type)0x0;
  (this->m_blockInfos).list.
  super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.count = 0;
  (this->m_blockInfos).list.length = 0;
  (this->m_blockInfos).list.increment = 4;
  (this->m_evalStack).list.
  super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.alloc = this_00;
  (this->m_evalStack).list.
  super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>._vptr_ReadOnlyList =
       (_func_int **)&PTR_IsReadOnly_01543b08;
  (this->m_evalStack).list.
  super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.buffer = (Type)0x0;
  (this->m_evalStack).list.
  super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count = 0;
  (this->m_evalStack).list.length = 0;
  (this->m_evalStack).list.increment = 4;
  pIVar5 = (IWasmByteCodeWriter *)new<Memory::ArenaAllocator>(8,this_00,0x364470);
  ppuVar6 = &PTR_Create_015439e8;
  pIVar5->_vptr_IWasmByteCodeWriter = (_func_int **)&PTR_Create_015439e8;
  this->m_emptyWriter = pIVar5;
  if (!validateOnly) {
    pIVar5 = (IWasmByteCodeWriter *)new<Memory::ArenaAllocator>(0x138,this_00,0x364470);
    memset(pIVar5 + 1,0,0x130);
    pIVar5[8]._vptr_IWasmByteCodeWriter = (_func_int **)(pIVar5 + 8);
    pIVar5[10]._vptr_IWasmByteCodeWriter = (_func_int **)(pIVar5 + 10);
    pIVar5[0xc]._vptr_IWasmByteCodeWriter = (_func_int **)(pIVar5 + 0xc);
    pIVar5[0xf]._vptr_IWasmByteCodeWriter = (_func_int **)0x0;
    pIVar5[0x10]._vptr_IWasmByteCodeWriter = (_func_int **)0x0;
    *(undefined8 *)((long)&pIVar5[0x10]._vptr_IWasmByteCodeWriter + 5) = 0;
    *(undefined8 *)((long)&pIVar5[0x11]._vptr_IWasmByteCodeWriter + 5) = 0;
    pIVar5[0x13]._vptr_IWasmByteCodeWriter = (_func_int **)0x0;
    pIVar5[0x14]._vptr_IWasmByteCodeWriter = (_func_int **)0x0;
    *(undefined8 *)((long)&pIVar5[0x14]._vptr_IWasmByteCodeWriter + 5) = 0;
    *(undefined8 *)((long)&pIVar5[0x15]._vptr_IWasmByteCodeWriter + 5) = 0;
    pIVar5[0x17]._vptr_IWasmByteCodeWriter = (_func_int **)0x0;
    pIVar5[0x18]._vptr_IWasmByteCodeWriter = (_func_int **)0x0;
    *(undefined8 *)((long)&pIVar5[0x18]._vptr_IWasmByteCodeWriter + 5) = 0;
    *(undefined8 *)((long)&pIVar5[0x19]._vptr_IWasmByteCodeWriter + 5) = 0;
    *(undefined4 *)&pIVar5[0x1f]._vptr_IWasmByteCodeWriter = 0xffffffff;
    *(undefined4 *)&pIVar5[0x20]._vptr_IWasmByteCodeWriter = 0;
    *(undefined4 *)((long)&pIVar5[0x21]._vptr_IWasmByteCodeWriter + 4) = 1;
    ppuVar6 = &PTR_Create_014dd3f8;
    pIVar5->_vptr_IWasmByteCodeWriter = (_func_int **)&PTR_Create_014dd3f8;
  }
  this->m_originalWriter = pIVar5;
  this->m_writer = pIVar5;
  (*(code *)*ppuVar6)(pIVar5);
  pWVar1 = (readerInfo->m_funcInfo).ptr;
  this->m_funcInfo = pWVar1;
  pWVar2 = (readerInfo->m_module).ptr;
  this->m_module = pWVar2;
  pWVar7 = (WasmBinaryReader *)(pWVar1->m_customReader).ptr;
  if (pWVar7 == (WasmBinaryReader *)0x0) {
    pWVar7 = (pWVar2->m_reader).ptr;
  }
  (**(pWVar7->super_WasmReaderBase)._vptr_WasmReaderBase)();
  pWVar7 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar7 == (WasmBinaryReader *)0x0) {
    pWVar7 = (this->m_module->m_reader).ptr;
  }
  uVar4 = (*(pWVar7->super_WasmReaderBase)._vptr_WasmReaderBase[4])();
  (*this->m_writer->_vptr_IWasmByteCodeWriter[5])(this->m_writer,this_00,(ulong)uVar4);
  return;
}

Assistant:

WasmBytecodeGenerator::WasmBytecodeGenerator(Js::ScriptContext* scriptContext, WasmReaderInfo* readerInfo, bool validateOnly) :
    m_scriptContext(scriptContext),
    m_alloc(_u("WasmBytecodeGen"), scriptContext->GetThreadContext()->GetPageAllocator(), Js::Throw::OutOfMemory),
    m_evalStack(&m_alloc),
    mTypedRegisterAllocator(&m_alloc, AllocateRegisterSpace, Simd::IsEnabled() ? 0 : 1 << WAsmJs::SIMD),
    m_blockInfos(&m_alloc),
    currentProfileId(0),
    isUnreachable(false)
{
    m_emptyWriter = Anew(&m_alloc, Js::EmptyWasmByteCodeWriter);
    m_writer = m_originalWriter = validateOnly ? m_emptyWriter : Anew(&m_alloc, Js::WasmByteCodeWriter);
    m_writer->Create();
    m_funcInfo = readerInfo->m_funcInfo;
    m_module = readerInfo->m_module;
    // Init reader to current func offset
    GetReader()->SeekToFunctionBody(m_funcInfo);

    const uint32 estimated = GetReader()->EstimateCurrentFunctionBytecodeSize();
    m_writer->InitData(&m_alloc, estimated);
}